

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O3

int __thiscall QTextCopyHelper::copy(QTextCopyHelper *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  QTextCursor *this_00;
  QTextDocumentPrivate *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  QTextTable *this_01;
  int iVar9;
  long in_FS_OFFSET;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  int local_bc;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  QTextFormat local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->cursor;
  bVar2 = QTextCursor::hasComplexSelection(this_00);
  if (bVar2) {
    this_01 = QTextCursor::currentTable(this_00);
    local_9c = -0x55555556;
    local_a0 = -0x55555556;
    local_a4 = -0x55555556;
    local_a8 = -0x55555556;
    QTextCursor::selectedTableCells(this_00,&local_9c,&local_a4,&local_a0,&local_a8);
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextTable::format((QTextTable *)local_68);
    iVar3 = 0;
    if (local_a8 != 1) {
      iVar3 = local_a8;
    }
    ::QVariant::QVariant((QVariant *)&local_58,iVar3);
    QTextFormat::setProperty((QTextFormat *)local_68,0x4100,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QTextFormat::clearProperty((QTextFormat *)local_68,0x4101);
    iVar3 = QTextFormatCollection::createObjectIndex(&this->dst->formats,(QTextFormat *)local_68);
    if (0 < local_a4) {
      local_bc = local_9c;
      iVar4 = local_a4;
      iVar5 = local_9c;
      iVar6 = local_a0;
      iVar8 = local_a8;
      do {
        iVar9 = iVar6;
        if (0 < iVar8) {
          do {
            local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextTable::cellAt((QTextTable *)local_78,(int)this_01,local_bc);
            iVar4 = QTextTableCell::rowSpan((QTextTableCell *)local_78);
            iVar5 = QTextTableCell::columnSpan((QTextTableCell *)local_78);
            if (((iVar4 == 1) ||
                (iVar6 = QTextTableCell::row((QTextTableCell *)local_78), iVar6 == local_bc)) &&
               ((iVar5 == 1 ||
                (iVar6 = QTextTableCell::column((QTextTableCell *)local_78), iVar6 == iVar9)))) {
              local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              QTextTableCell::format((QTextTableCell *)local_88);
              if (local_a4 + local_9c <= iVar4 + local_bc) {
                iVar4 = (local_a4 + local_9c) - local_bc;
                if (iVar4 < 2) {
                  QTextFormat::clearProperty((QTextFormat *)local_88,0x4810);
                }
                else {
                  ::QVariant::QVariant((QVariant *)&local_58,iVar4);
                  QTextFormat::setProperty((QTextFormat *)local_88,0x4810,(QVariant *)&local_58);
                  ::QVariant::~QVariant((QVariant *)&local_58);
                }
              }
              if (local_a8 + local_a0 <= iVar5 + iVar9) {
                iVar4 = (local_a8 + local_a0) - iVar9;
                if (iVar4 < 2) {
                  QTextFormat::clearProperty((QTextFormat *)local_88,0x4811);
                }
                else {
                  ::QVariant::QVariant((QVariant *)&local_58,iVar4);
                  QTextFormat::setProperty((QTextFormat *)local_88,0x4811,(QVariant *)&local_58);
                  ::QVariant::~QVariant((QVariant *)&local_58);
                }
              }
              iVar5 = convertFormatIndex(this,(QTextFormat *)local_88,iVar3);
              iVar4 = QTextTableCell::firstPosition((QTextTableCell *)local_78);
              local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
              local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              pQVar1 = this->src;
              uVar7 = QFragmentMapData<QTextBlockData>::findNode(&(pQVar1->blocks).data,iVar4,0);
              local_58._8_4_ = uVar7;
              local_58.shared = (PrivateShared *)pQVar1;
              iVar6 = QTextBlock::position((QTextBlock *)&local_58);
              iVar8 = -2;
              if (iVar6 == iVar4) {
                QTextBlock::blockFormat((QTextBlock *)&local_98);
                iVar8 = convertFormatIndex(this,&local_98,-1);
                QTextFormat::~QTextFormat(&local_98);
              }
              QTextDocumentPrivate::insertBlock
                        (this->dst,(QChar)0xfdd0,this->insertPos,iVar8,iVar5,MoveCursor);
              this->insertPos = this->insertPos + 1;
              iVar5 = QTextTableCell::lastPosition((QTextTableCell *)local_78);
              if (iVar4 < iVar5) {
                iVar5 = QTextTableCell::lastPosition((QTextTableCell *)local_78);
                for (; iVar4 < iVar5; iVar4 = iVar4 + iVar6) {
                  iVar6 = appendFragment(this,iVar4,iVar5,-1);
                }
              }
              QTextFormat::~QTextFormat((QTextFormat *)local_88);
            }
            iVar9 = iVar9 + 1;
            iVar4 = local_a4;
            iVar5 = local_9c;
            iVar6 = local_a0;
            iVar8 = local_a8;
          } while (iVar9 < local_a8 + local_a0);
        }
        local_bc = local_bc + 1;
      } while (local_bc < iVar4 + iVar5);
    }
    iVar4 = QTextFrame::lastPosition(&this_01->super_QTextFrame);
    appendFragment(this,iVar4,iVar4 + 1,iVar3);
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
  }
  else {
    iVar3 = QTextCursor::selectionStart(this_00);
    iVar4 = QTextCursor::selectionEnd(this_00);
    for (; iVar3 < iVar4; iVar3 = iVar3 + iVar5) {
      iVar5 = appendFragment(this,iVar3,iVar4,-1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextCopyHelper::copy()
{
    if (cursor.hasComplexSelection()) {
        QTextTable *table = cursor.currentTable();
        int row_start, col_start, num_rows, num_cols;
        cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        QTextTableFormat tableFormat = table->format();
        tableFormat.setColumns(num_cols);
        tableFormat.clearColumnWidthConstraints();
        const int objectIndex = dst->formatCollection()->createObjectIndex(tableFormat);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                const int rspan = cell.rowSpan();
                const int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                // add the QTextBeginningOfFrame
                QTextCharFormat cellFormat = cell.format();
                if (r + rspan >= row_start + num_rows) {
                    cellFormat.setTableCellRowSpan(row_start + num_rows - r);
                }
                if (c + cspan >= col_start + num_cols) {
                    cellFormat.setTableCellColumnSpan(col_start + num_cols - c);
                }
                const int charFormatIndex = convertFormatIndex(cellFormat, objectIndex);

                int blockIdx = -2;
                const int cellPos = cell.firstPosition();
                QTextBlock block = src->blocksFind(cellPos);
                if (block.position() == cellPos) {
                    blockIdx = convertFormatIndex(block.blockFormat());
                }

                dst->insertBlock(QTextBeginningOfFrame, insertPos, blockIdx, charFormatIndex);
                ++insertPos;

                // nothing to add for empty cells
                if (cell.lastPosition() > cellPos) {
                    // add the contents
                    appendFragments(cellPos, cell.lastPosition());
                }
            }
        }

        // add end of table
        int end = table->lastPosition();
        appendFragment(end, end+1, objectIndex);
    } else {
        appendFragments(cursor.selectionStart(), cursor.selectionEnd());
    }
}